

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscDecompiler.cpp
# Opt level: O0

void NscScriptDecompile(CNwnStream *sStream,uchar *pauchData,unsigned_long ulSize,
                       NscCompiler *pCompiler)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  NscCompiler *pCompiler_00;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  char szText [1024];
  unsigned_long ul_3;
  unsigned_long ul3_1;
  unsigned_long ul2_6;
  unsigned_long ul1_16;
  unsigned_long ul1_15;
  unsigned_long ul1_14;
  unsigned_long ul2_5;
  unsigned_long ul1_13;
  unsigned_long ul2_4;
  unsigned_long ul1_12;
  unsigned_long ul1_11;
  unsigned_long ul1_10;
  unsigned_long ul1_9;
  unsigned_long ul3;
  unsigned_long ul2_3;
  unsigned_long ul1_8;
  unsigned_long ul1_7;
  unsigned_long ul1_6;
  unsigned_long ul1_5;
  unsigned_long ul_2;
  unsigned_long ul1_4;
  unsigned_long ul1_3;
  uchar cOpType_2;
  char *pszName;
  unsigned_long ul2_2;
  unsigned_long ul1_2;
  unsigned_long ulCopy;
  char szValue [129];
  unsigned_long ul_1;
  anon_union_8_2_7f9ecff0 val;
  unsigned_long ul;
  uchar cOpType_1;
  unsigned_long ul2_1;
  unsigned_long ul1_1;
  uchar cOpType;
  unsigned_long ul2;
  unsigned_long ul1;
  uchar cOp;
  uchar *pOp;
  char *pszOpRoot;
  char szOpType [32];
  char szOpText [512];
  char szByteText [128];
  uchar *pData;
  uchar *pEnd;
  uchar *pStart;
  float *in_stack_fffffffffffff738;
  uchar *in_stack_fffffffffffff740;
  uchar cOpType_00;
  uchar *__n;
  char local_8a8 [4];
  int in_stack_fffffffffffff75c;
  undefined8 local_4a0;
  undefined8 local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined8 local_460;
  undefined8 local_458;
  long local_450;
  undefined8 local_448;
  undefined8 local_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined8 local_428;
  long local_420;
  long local_418;
  long local_410;
  undefined8 local_400;
  undefined8 local_3f8;
  undefined8 local_3d8;
  uchar local_3c8 [144];
  uchar *local_338;
  float local_330;
  undefined4 uStack_32c;
  undefined8 local_328;
  byte local_319;
  undefined8 local_318;
  undefined8 local_310;
  byte local_301;
  undefined8 local_300;
  undefined8 local_2f8;
  byte local_2e9;
  byte *local_2e8;
  char *local_2e0;
  undefined1 local_2d8 [32];
  char local_2b8 [512];
  char local_b8 [128];
  byte *local_38;
  byte *local_30;
  long local_28;
  long *local_8;
  
  local_30 = (byte *)(in_RSI + in_RDX);
  local_38 = (byte *)(in_RSI + 8);
  local_28 = in_RSI;
  local_8 = in_RDI;
  do {
    if (local_30 <= local_38) {
      return;
    }
    local_2e8 = local_38;
    pbVar3 = local_38 + 1;
    local_2e9 = *local_38;
    pCompiler_00 = (NscCompiler *)(ulong)(local_2e9 - 1);
    cOpType_00 = (uchar)((ulong)in_stack_fffffffffffff740 >> 0x38);
    switch(pCompiler_00) {
    case (NscCompiler *)0x0:
      if ((local_30 < local_38 + 8) || (*pbVar3 != 1)) break;
      local_38 = pbVar3;
      local_38 = GetUINT32(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
      local_38 = GetUINT16(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
      sprintf(local_b8,"%02X 01 %08X %04X",(ulong)local_2e9,local_2f8,local_300);
      sprintf(local_2b8,"CPDOWNSP %08X, %04X",local_2f8,local_300);
      goto LAB_001f52e7;
    case (NscCompiler *)0x1:
      local_2e0 = "RSADD";
      goto LAB_001f3eb8;
    case (NscCompiler *)0x2:
      if ((local_38 + 8 <= local_30) && (*pbVar3 == 1)) {
        local_38 = pbVar3;
        local_38 = GetUINT32(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        local_38 = GetUINT16(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        sprintf(local_b8,"%02X 01 %08X %04X",(ulong)local_2e9,local_310,local_318);
        sprintf(local_2b8,"CPTOPSP %08X, %04X",local_310,local_318);
        goto LAB_001f52e7;
      }
      break;
    case (NscCompiler *)0x3:
      if (local_38 + 2 <= local_30) {
        local_319 = *pbVar3;
        local_38 = pbVar3;
        GetOpText(cOpType_00,(char *)in_stack_fffffffffffff738);
        pbVar3 = local_38;
        switch(local_319) {
        case 3:
        case 6:
          if (local_38 + 5 <= local_30) {
            local_38 = GetUINT32(in_stack_fffffffffffff740,
                                 (unsigned_long *)in_stack_fffffffffffff738);
            sprintf(local_b8,"%02X %02X %08X",(ulong)local_2e9,(ulong)local_319,local_328);
            sprintf(local_2b8,"CONST%s %08X",local_2d8,local_328);
            goto LAB_001f52e7;
          }
          break;
        case 4:
          if (local_38 + 5 <= local_30) {
            local_38 = GetFLOAT(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
            sprintf(local_b8,"%02X %02X %08X",(ulong)local_2e9,(ulong)local_319,
                    CONCAT44(uStack_32c,local_330));
            sprintf(local_2b8,"CONST%s %f",(double)local_330,local_2d8);
            goto LAB_001f52e7;
          }
          break;
        case 5:
          if ((local_38 + 3 <= local_30) &&
             (GetUINT16(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738),
             pbVar3 = local_38, local_38 + (long)(local_338 + 3) <= local_30)) {
            local_38 = local_38 + 3;
            __n = local_338;
            if ((uchar *)0x80 < local_338) {
              __n = (uchar *)0x80;
            }
            in_stack_fffffffffffff740 = __n;
            memmove(local_3c8,local_38,(size_t)__n);
            local_3c8[(long)__n] = '\0';
            sprintf(local_b8,"%02X %02X %04X str",(ulong)local_2e9,(ulong)local_319,local_338);
            snprintf(local_2b8,0x200,"CONST%s \"%s\"",local_2d8,local_3c8);
            local_38 = local_338 + (long)local_38;
            goto LAB_001f52e7;
          }
        }
      }
      break;
    case (NscCompiler *)0x4:
      if ((local_38 + 5 <= local_30) && (*pbVar3 == 0)) {
        local_38 = pbVar3;
        pbVar3 = GetUINT16(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        local_38 = pbVar3 + 1;
        bVar1 = *pbVar3;
        pcVar2 = NscGetActionName(in_stack_fffffffffffff75c,pCompiler_00);
        sprintf(local_b8,"%02X 00 %04X %02X",(ulong)local_2e9,local_3d8,(ulong)bVar1);
        sprintf(local_2b8,"ACTION %s(%04X), %02X",pcVar2,local_3d8,(ulong)bVar1);
        goto LAB_001f52e7;
      }
      break;
    case (NscCompiler *)0x5:
      local_2e0 = "LOGAND";
      goto LAB_001f4406;
    case (NscCompiler *)0x6:
      local_2e0 = "LOGOR";
      goto LAB_001f4406;
    case (NscCompiler *)0x7:
      local_2e0 = "INCOR";
      goto LAB_001f4406;
    case (NscCompiler *)0x8:
      local_2e0 = "EXCOR";
      goto LAB_001f4406;
    case (NscCompiler *)0x9:
      local_2e0 = "BOOLAND";
      goto LAB_001f4406;
    case (NscCompiler *)0xa:
      local_2e0 = "EQUAL";
      goto LAB_001f4406;
    case (NscCompiler *)0xb:
      local_2e0 = "NEQUAL";
      goto LAB_001f4406;
    case (NscCompiler *)0xc:
      local_2e0 = "GEQ";
      goto LAB_001f4406;
    case (NscCompiler *)0xd:
      local_2e0 = "GT";
      goto LAB_001f4406;
    case (NscCompiler *)0xe:
      local_2e0 = "LT";
      goto LAB_001f4406;
    case (NscCompiler *)0xf:
      local_2e0 = "LEQ";
      goto LAB_001f4406;
    case (NscCompiler *)0x10:
      local_2e0 = "SHLEFT";
      goto LAB_001f4406;
    case (NscCompiler *)0x11:
      local_2e0 = "SHRIGHT";
      goto LAB_001f4406;
    case (NscCompiler *)0x12:
      local_2e0 = "USHRIGHT";
      goto LAB_001f4406;
    case (NscCompiler *)0x13:
      local_2e0 = "ADD";
      goto LAB_001f4406;
    case (NscCompiler *)0x14:
      local_2e0 = "SUB";
      goto LAB_001f4406;
    case (NscCompiler *)0x15:
      local_2e0 = "MUL";
      goto LAB_001f4406;
    case (NscCompiler *)0x16:
      local_2e0 = "DIV";
      goto LAB_001f4406;
    case (NscCompiler *)0x17:
      local_2e0 = "MOD";
LAB_001f4406:
      if (local_30 < local_38 + 2) break;
      local_38 = local_38 + 2;
      bVar1 = *pbVar3;
      GetOpText(cOpType_00,(char *)in_stack_fffffffffffff738);
      if (bVar1 == 0x24) {
        pbVar3 = local_38;
        if (local_30 < local_38 + 2) break;
        local_38 = GetUINT16(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        sprintf(local_b8,"%02X %02X %04X",(ulong)local_2e9,0x24,local_3f8);
        sprintf(local_2b8,"%s%s %04X",local_2e0,local_2d8,local_3f8);
      }
      else {
        sprintf(local_b8,"%02X %02X",(ulong)local_2e9,(ulong)bVar1);
        sprintf(local_2b8,"%s%s",local_2e0,local_2d8);
      }
      goto LAB_001f52e7;
    case (NscCompiler *)0x18:
      local_2e0 = "NEG";
      goto LAB_001f3eb8;
    case (NscCompiler *)0x19:
      local_2e0 = "COMP";
      goto LAB_001f3eb8;
    case (NscCompiler *)0x1a:
      if ((local_38 + 6 <= local_30) && (*pbVar3 == 0)) {
        local_38 = pbVar3;
        local_38 = GetUINT32(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        sprintf(local_b8,"%02X 00 %08X",(ulong)local_2e9,local_400);
        sprintf(local_2b8,"MOVSP %08X",local_400);
        goto LAB_001f52e7;
      }
      break;
    case (NscCompiler *)0x1b:
      if (local_38 + 2 <= local_30) {
        local_38 = local_38 + 2;
        bVar1 = *pbVar3;
        sprintf(local_b8,"%02X %02X",(ulong)local_2e9,(ulong)bVar1);
        sprintf(local_2b8,"SAVE_STATEALL %02x",(ulong)bVar1);
        goto LAB_001f52e7;
      }
      break;
    case (NscCompiler *)0x1c:
      if ((local_38 + 6 <= local_30) && (*pbVar3 == 0)) {
        local_38 = pbVar3;
        local_38 = GetUINT32(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        sprintf(local_b8,"%02X 00 %08X",(ulong)local_2e9,local_410);
        sprintf(local_2b8,"JMP off_%08X",local_2e8 + (local_410 - local_28));
        goto LAB_001f52e7;
      }
      break;
    case (NscCompiler *)0x1d:
      if ((local_38 + 6 <= local_30) && (*pbVar3 == 0)) {
        local_38 = pbVar3;
        local_38 = GetUINT32(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        sprintf(local_b8,"%02X 00 %08X",(ulong)local_2e9,local_418);
        sprintf(local_2b8,"JSR fn_%08X",local_2e8 + (local_418 - local_28));
        goto LAB_001f52e7;
      }
      break;
    case (NscCompiler *)0x1e:
      if ((local_38 + 6 <= local_30) && (*pbVar3 == 0)) {
        local_38 = pbVar3;
        local_38 = GetUINT32(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        sprintf(local_b8,"%02X 00 %08X",(ulong)local_2e9,local_420);
        sprintf(local_2b8,"JZ off_%08X",local_2e8 + (local_420 - local_28));
        goto LAB_001f52e7;
      }
      break;
    case (NscCompiler *)0x1f:
      if ((local_38 + 2 <= local_30) && (*pbVar3 == 0)) {
        local_38 = local_38 + 2;
        sprintf(local_b8,"%02X 00",(ulong)local_2e9);
        sprintf(local_2b8,"RETN");
        goto LAB_001f52e7;
      }
      break;
    case (NscCompiler *)0x20:
      if ((local_38 + 8 <= local_30) && (*pbVar3 == 1)) {
        local_38 = pbVar3;
        local_38 = GetUINT16(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        local_38 = GetUINT16(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        local_38 = GetUINT16(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        sprintf(local_b8,"%02X 01 %04X %04X %04x",(ulong)local_2e9,local_428,local_430,local_438);
        sprintf(local_2b8,"DESTRUCT %04X, %04X, %04X",local_428,local_430,local_438);
        goto LAB_001f52e7;
      }
      break;
    case (NscCompiler *)0x21:
      local_2e0 = "NOT";
LAB_001f3eb8:
      if (local_30 < local_38 + 2) break;
      local_38 = local_38 + 2;
      local_301 = *pbVar3;
      GetOpText(cOpType_00,(char *)in_stack_fffffffffffff738);
      sprintf(local_b8,"%02X %02X",(ulong)local_2e9,(ulong)local_301);
      sprintf(local_2b8,"%s%s",local_2e0,local_2d8);
      goto LAB_001f52e7;
    case (NscCompiler *)0x22:
      if ((local_38 + 6 <= local_30) && (*pbVar3 == 3)) {
        local_38 = pbVar3;
        local_38 = GetUINT32(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        sprintf(local_b8,"%02X 03 %08X",(ulong)local_2e9,local_440);
        sprintf(local_2b8,"DECISP %08X",local_440);
        goto LAB_001f52e7;
      }
      break;
    case (NscCompiler *)0x23:
      if ((local_38 + 6 <= local_30) && (*pbVar3 == 3)) {
        local_38 = pbVar3;
        local_38 = GetUINT32(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        sprintf(local_b8,"%02X 03 %08X",(ulong)local_2e9,local_448);
        sprintf(local_2b8,"INCISP %08X",local_448);
        goto LAB_001f52e7;
      }
      break;
    case (NscCompiler *)0x24:
      if ((local_38 + 6 <= local_30) && (*pbVar3 == 0)) {
        local_38 = pbVar3;
        local_38 = GetUINT32(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        sprintf(local_b8,"%02X 00 %08X",(ulong)local_2e9,local_450);
        sprintf(local_2b8,"JNZ off_%08X",local_2e8 + (local_450 - local_28));
        goto LAB_001f52e7;
      }
      break;
    case (NscCompiler *)0x25:
      if ((local_38 + 8 <= local_30) && (*pbVar3 == 1)) {
        local_38 = pbVar3;
        local_38 = GetUINT32(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        local_38 = GetUINT16(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        sprintf(local_b8,"%02X 01 %08X %04X",(ulong)local_2e9,local_458,local_460);
        sprintf(local_2b8,"CPDOWNBP %08X, %04X",local_458,local_460);
        goto LAB_001f52e7;
      }
      break;
    case (NscCompiler *)0x26:
      if ((local_38 + 8 <= local_30) && (*pbVar3 == 1)) {
        local_38 = pbVar3;
        local_38 = GetUINT32(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        local_38 = GetUINT16(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        sprintf(local_b8,"%02X 01 %08X %04X",(ulong)local_2e9,local_468,local_470);
        sprintf(local_2b8,"CPTOPBP %08X, %04X",local_468,local_470);
        goto LAB_001f52e7;
      }
      break;
    case (NscCompiler *)0x27:
      if ((local_38 + 6 <= local_30) && (*pbVar3 == 3)) {
        local_38 = pbVar3;
        local_38 = GetUINT32(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        sprintf(local_b8,"%02X 03 %08X",(ulong)local_2e9,local_478);
        sprintf(local_2b8,"DECIBP %08X",local_478);
        goto LAB_001f52e7;
      }
      break;
    case (NscCompiler *)0x28:
      if ((local_38 + 6 <= local_30) && (*pbVar3 == 3)) {
        local_38 = pbVar3;
        local_38 = GetUINT32(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        sprintf(local_b8,"%02X 03 %08X",(ulong)local_2e9,local_480);
        sprintf(local_2b8,"INCIBP %08X",local_480);
        goto LAB_001f52e7;
      }
      break;
    case (NscCompiler *)0x29:
      if ((local_38 + 2 <= local_30) && (*pbVar3 == 0)) {
        local_38 = local_38 + 2;
        sprintf(local_b8,"%02X 00",(ulong)local_2e9);
        sprintf(local_2b8,"SAVEBP");
        goto LAB_001f52e7;
      }
      break;
    case (NscCompiler *)0x2a:
      if ((local_38 + 2 <= local_30) && (*pbVar3 == 0)) {
        local_38 = local_38 + 2;
        sprintf(local_b8,"%02X 00",(ulong)local_2e9);
        sprintf(local_2b8,"RESTOREBP");
        goto LAB_001f52e7;
      }
      break;
    case (NscCompiler *)0x2b:
      if (local_38 + 10 <= local_30) {
        local_38 = local_38 + 2;
        bVar1 = *pbVar3;
        local_38 = GetUINT32(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        local_38 = GetUINT32(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        sprintf(local_b8,"%02X %02X %08X %08X",(ulong)local_2e9,(ulong)bVar1,local_488,local_490);
        sprintf(local_2b8,"STORE_STATE %02X, %08X, %08X",(ulong)bVar1,local_488,local_490);
        goto LAB_001f52e7;
      }
      break;
    case (NscCompiler *)0x2c:
      if ((local_38 + 2 <= local_30) && (*pbVar3 == 0)) {
        local_38 = local_38 + 2;
        sprintf(local_b8,"%02X 00",(ulong)local_2e9);
        sprintf(local_2b8,"NOP");
        goto LAB_001f52e7;
      }
      break;
    default:
      break;
    case (NscCompiler *)0x41:
      if (local_38 + 5 <= local_30) {
        local_38 = pbVar3;
        local_38 = GetUINT32(in_stack_fffffffffffff740,(unsigned_long *)in_stack_fffffffffffff738);
        sprintf(local_b8,"%02X %08X",(ulong)local_2e9,local_4a0);
        sprintf(local_2b8,"T %08X",local_4a0);
        goto LAB_001f52e7;
      }
    }
    local_38 = pbVar3;
    sprintf(local_b8,"%02X",(ulong)local_2e9);
    sprintf(local_2b8,"??");
LAB_001f52e7:
    sprintf(local_8a8,"%08X %-24s %s",(long)local_2e8 - local_28,local_b8,local_2b8);
    (**(code **)(*local_8 + 0x30))(local_8,local_8a8,1);
  } while( true );
}

Assistant:

void NscScriptDecompile (CNwnStream &sStream, 
	unsigned char *pauchData, unsigned long ulSize, NscCompiler *pCompiler)
{

	//
	// Loop through the data
	//

	unsigned char *pStart = pauchData;
	unsigned char *pEnd = &pauchData [ulSize];
	unsigned char *pData = pStart;
	pData += 8;
	while (pData < pEnd)
	{
		char szByteText [128];
		char szOpText [512];
		char szOpType [32];
		char *pszOpRoot;

		//
		// Switch based on the next opcode
		//

		unsigned char *pOp = pData;
		unsigned char cOp = *pData++;
		switch (cOp)
		{

			case NscCode_CPDOWNSP:
				{
					if (&pData [7] > pEnd || pData [0] != 1)
						goto invalid_op;
					unsigned long ul1, ul2;
					pData = GetUINT32 (pData + 1, &ul1);
					pData = GetUINT16 (pData, &ul2);
					sprintf (szByteText, "%02X 01 %08X %04X", cOp, ul1, ul2);
					sprintf (szOpText, "CPDOWNSP %08X, %04X", ul1, ul2);
				}
				break;

			case NscCode_RSADD:
				pszOpRoot = "RSADD";
do_simple_operator:;
				{
					if (&pData [1] > pEnd)
						goto invalid_op;
					unsigned char cOpType = *pData++;
					GetOpText (cOpType, szOpType);
					sprintf (szByteText, "%02X %02X", cOp, cOpType);
					sprintf (szOpText, "%s%s", pszOpRoot, szOpType);
				}
				break;

			case NscCode_CPTOPSP:
				{
					if (&pData [7] > pEnd || pData [0] != 1)
						goto invalid_op;
					unsigned long ul1, ul2;
					pData = GetUINT32 (pData + 1, &ul1);
					pData = GetUINT16 (pData, &ul2);
					sprintf (szByteText, "%02X 01 %08X %04X", cOp, ul1, ul2);
					sprintf (szOpText, "CPTOPSP %08X, %04X", ul1, ul2);
				}
				break;

			case NscCode_CONST:
				{
					if (&pData [1] > pEnd)
						goto invalid_op;
					unsigned char cOpType = *pData;
					GetOpText (cOpType, szOpType);
					switch (cOpType)
					{
						case 3:
						case 6:
							{
								if (&pData [5] > pEnd)
									goto invalid_op;
								unsigned long ul;
								pData = GetUINT32 (pData + 1, &ul);
								sprintf (szByteText, "%02X %02X %08X", cOp, cOpType, ul);
								sprintf (szOpText, "CONST%s %08X", szOpType, ul);
							}
							break;

						case 4:
							{
								if (&pData [5] > pEnd)
									goto invalid_op;
								union
								{
									unsigned long ul;
									float f;
								} val;
								pData = GetFLOAT (pData + 1, &val .f);
								sprintf (szByteText, "%02X %02X %08X", cOp, cOpType, val .ul);
								sprintf (szOpText, "CONST%s %f", szOpType, val .f);
							}
							break;

						case 5:
							{
								if (&pData [3] > pEnd)
									goto invalid_op;
								unsigned long ul;
								GetUINT16 (pData + 1, &ul);
								if (&pData [3 + ul] > pEnd)
									goto invalid_op;
								pData += 3;
								char szValue [129];
								unsigned long ulCopy = ul > 128 ? 128 : ul;
								memmove (szValue, pData, ulCopy);
								szValue [ulCopy] = 0;
								sprintf (szByteText, "%02X %02X %04X str", cOp, cOpType, ul);
								snprintf (szOpText, _countof (szOpText), 
									"CONST%s \"%s\"", szOpType, szValue);
								pData += ul;
							}
							break;

						default:
							goto invalid_op;
					}
				}
				break;

			case NscCode_ACTION:
				{
					if (&pData [4] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1, ul2;
					pData = GetUINT16 (pData + 1, &ul1);
					ul2 = *pData++;
					const char *pszName = NscGetActionName ((int) ul1, pCompiler);
					sprintf (szByteText, "%02X 00 %04X %02X", cOp, ul1, ul2);
					sprintf (szOpText, "ACTION %s(%04X), %02X", pszName, ul1, ul2);
				}
				break;

			case NscCode_LOGAND:
				pszOpRoot = "LOGAND";
do_binary_operator:;
				{
					if (&pData [1] > pEnd)
						goto invalid_op;
					unsigned char cOpType = *pData++;
					GetOpText (cOpType, szOpType);
					if (cOpType == 0x24)
					{
						if (&pData [2] > pEnd)
							goto invalid_op;
						unsigned long ul1;
						pData = GetUINT16 (pData, &ul1);
						sprintf (szByteText, "%02X %02X %04X", cOp, cOpType, ul1);
						sprintf (szOpText, "%s%s %04X", pszOpRoot, szOpType, ul1);
					}
					else
					{
						sprintf (szByteText, "%02X %02X", cOp, cOpType);
						sprintf (szOpText, "%s%s", pszOpRoot, szOpType);
					}
				}
				break;

			case NscCode_LOGOR:
				pszOpRoot = "LOGOR";
				goto do_binary_operator;

			case NscCode_INCOR:
				pszOpRoot = "INCOR";
				goto do_binary_operator;

			case NscCode_EXCOR:
				pszOpRoot = "EXCOR";
				goto do_binary_operator;

			case NscCode_BOOLAND:
				pszOpRoot = "BOOLAND";
				goto do_binary_operator;

			case NscCode_EQUAL:
				pszOpRoot = "EQUAL";
				goto do_binary_operator;

			case NscCode_NEQUAL:
				pszOpRoot = "NEQUAL";
				goto do_binary_operator;

			case NscCode_GEQ:
				pszOpRoot = "GEQ";
				goto do_binary_operator;

			case NscCode_GT:
				pszOpRoot = "GT";
				goto do_binary_operator;

			case NscCode_LT:
				pszOpRoot = "LT";
				goto do_binary_operator;

			case NscCode_LEQ:
				pszOpRoot = "LEQ";
				goto do_binary_operator;

			case NscCode_SHLEFT:
				pszOpRoot = "SHLEFT";
				goto do_binary_operator;

			case NscCode_SHRIGHT:
				pszOpRoot = "SHRIGHT";
				goto do_binary_operator;

			case NscCode_USHRIGHT:
				pszOpRoot = "USHRIGHT";
				goto do_binary_operator;

			case NscCode_ADD:
				pszOpRoot = "ADD";
				goto do_binary_operator;

			case NscCode_SUB:
				pszOpRoot = "SUB";
				goto do_binary_operator;

			case NscCode_MUL:
				pszOpRoot = "MUL";
				goto do_binary_operator;

			case NscCode_DIV:
				pszOpRoot = "DIV";
				goto do_binary_operator;

			case NscCode_MOD:
				pszOpRoot = "MOD";
				goto do_binary_operator;

			case NscCode_NEG:
				pszOpRoot = "NEG";
				goto do_simple_operator;

			case NscCode_COMP:
				pszOpRoot = "COMP";
				goto do_simple_operator;

			case NscCode_MOVSP:
				{
					if (&pData [5] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 00 %08X", cOp, ul1);
					sprintf (szOpText, "MOVSP %08X", ul1);
				}
				break;

			case NscCode_STORE_STATEALL:
				{
					if (&pData [1] > pEnd)
						goto invalid_op;
					unsigned long ul = *pData++;
					sprintf (szByteText, "%02X %02X", cOp, ul);
					sprintf (szOpText, "SAVE_STATEALL %02x", ul);
				}
				break;

			case NscCode_JMP:
				{
					if (&pData [5] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 00 %08X", cOp, ul1);
					sprintf (szOpText, "JMP off_%08X", (pOp - pStart) + ul1);
				}
				break;

			case NscCode_JSR:
				{
					if (&pData [5] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 00 %08X", cOp, ul1);
					sprintf (szOpText, "JSR fn_%08X", (pOp - pStart) + ul1);
				}
				break;

			case NscCode_JZ:
				{
					if (&pData [5] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 00 %08X", cOp, ul1);
					sprintf (szOpText, "JZ off_%08X", (pOp - pStart) + ul1);
				}
				break;

			case NscCode_RETN:
				{
					if (&pData [1] > pEnd || pData [0] != 0)
						goto invalid_op;
					pData++;
					sprintf (szByteText, "%02X 00", cOp);
					sprintf (szOpText, "RETN");
				}
				break;

			case NscCode_DESTRUCT:
				{
					if (&pData [7] > pEnd || pData [0] != 1)
						goto invalid_op;
					unsigned long ul1, ul2, ul3;
					pData = GetUINT16 (pData + 1, &ul1);
					pData = GetUINT16 (pData, &ul2);
					pData = GetUINT16 (pData, &ul3);
					sprintf (szByteText, "%02X 01 %04X %04X %04x", cOp, ul1, ul2, ul3);
					sprintf (szOpText, "DESTRUCT %04X, %04X, %04X", ul1, ul2, ul3);
					// First parameter, number of bytes to destroy
					// Second parameter, offset of element not to destroy
					// Third parameter, number of bytes no to destroy
				}
				break;

			case NscCode_NOT:
				pszOpRoot = "NOT";
				goto do_simple_operator;

			case NscCode_DECISP:
				{
					if (&pData [5] > pEnd || pData [0] != 3)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 03 %08X", cOp, ul1);
					sprintf (szOpText, "DECISP %08X", ul1);
				}
				break;

			case NscCode_INCISP:
				{
					if (&pData [5] > pEnd || pData [0] != 3)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 03 %08X", cOp, ul1);
					sprintf (szOpText, "INCISP %08X", ul1);
				}
				break;

			case NscCode_JNZ:
				{
					if (&pData [5] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 00 %08X", cOp, ul1);
					sprintf (szOpText, "JNZ off_%08X", (pOp - pStart) + ul1);
				}
				break;

			case NscCode_CPDOWNBP:
				{
					if (&pData [7] > pEnd || pData [0] != 1)
						goto invalid_op;
					unsigned long ul1, ul2;
					pData = GetUINT32 (pData + 1, &ul1);
					pData = GetUINT16 (pData, &ul2);
					sprintf (szByteText, "%02X 01 %08X %04X", cOp, ul1, ul2);
					sprintf (szOpText, "CPDOWNBP %08X, %04X", ul1, ul2);
				}
				break;

			case NscCode_CPTOPBP:
				{
					if (&pData [7] > pEnd || pData [0] != 1)
						goto invalid_op;
					unsigned long ul1, ul2;
					pData = GetUINT32 (pData + 1, &ul1);
					pData = GetUINT16 (pData, &ul2);
					sprintf (szByteText, "%02X 01 %08X %04X", cOp, ul1, ul2);
					sprintf (szOpText, "CPTOPBP %08X, %04X", ul1, ul2);
				}
				break;

			case NscCode_DECIBP:
				{
					if (&pData [5] > pEnd || pData [0] != 3)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 03 %08X", cOp, ul1);
					sprintf (szOpText, "DECIBP %08X", ul1);
				}
				break;

			case NscCode_INCIBP:
				{
					if (&pData [5] > pEnd || pData [0] != 3)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 03 %08X", cOp, ul1);
					sprintf (szOpText, "INCIBP %08X", ul1);
				}
				break;

			case NscCode_SAVEBP:
				{
					if (&pData [1] > pEnd || pData [0] != 0)
						goto invalid_op;
					pData++;
					sprintf (szByteText, "%02X 00", cOp);
					sprintf (szOpText, "SAVEBP");
				}
				break;

			case NscCode_RESTOREBP:
				{
					if (&pData [1] > pEnd || pData [0] != 0)
						goto invalid_op;
					pData++;
					sprintf (szByteText, "%02X 00", cOp);
					sprintf (szOpText, "RESTOREBP");
				}
				break;

			case NscCode_STORE_STATE:
				{
					if (&pData [9] > pEnd)
						goto invalid_op;
					unsigned long ul1, ul2, ul3;
					ul3 = *pData++;
					pData = GetUINT32 (pData, &ul1);
					pData = GetUINT32 (pData, &ul2);
					sprintf (szByteText, "%02X %02X %08X %08X", cOp, ul3, ul1, ul2);
					sprintf (szOpText, "STORE_STATE %02X, %08X, %08X", ul3, ul1, ul2);
				    // First value is BP stack size to save
					// second value is SP stack size to save
				}
				break;

			case NscCode_NOP:
				{
					if (&pData [1] > pEnd || pData [0] != 0)
						goto invalid_op;
					pData++;
					sprintf (szByteText, "%02X 00", cOp);
					sprintf (szOpText, "NOP");
				}
				break;

			case NscCode_Size:
				{
					if (&pData [4] > pEnd)
						goto invalid_op;
					unsigned long ul;
					pData = GetUINT32 (pData, &ul);
					sprintf (szByteText, "%02X %08X", cOp, ul);
					sprintf (szOpText, "T %08X", ul);
				}
				break;

			default:
invalid_op:;
				sprintf (szByteText, "%02X", cOp);
				sprintf (szOpText, "??");
				//if (g_fpDebug)
				//	fprintf (g_fpDebug, "Unknown opcode %02x\r\n", cOp);
				break;
		}

		//
		// Format the final line
		//

		char szText [1024];
		sprintf (szText, "%08X %-24s %s", pOp - pStart, szByteText, szOpText);
		sStream .WriteLine (szText);
	}
}